

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_reader_skip_using_fill(mpack_reader_t *reader,size_t count)

{
  char *p;
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = reader->size;
  for (; p = reader->buffer, sVar2 < count; count = count - sVar2) {
    sVar1 = mpack_fill_range(reader,p,sVar2,sVar2);
    sVar2 = reader->size;
    if (sVar1 < sVar2) goto LAB_0010853d;
  }
  reader->data = p;
  sVar2 = mpack_fill_range(reader,p,count,sVar2);
  if (count <= sVar2) {
    reader->end = reader->data + sVar2;
    reader->data = reader->data + count;
    return;
  }
LAB_0010853d:
  mpack_reader_flag_error(reader,mpack_error_io);
  return;
}

Assistant:

MPACK_NOINLINE static void mpack_reader_skip_using_fill(mpack_reader_t* reader, size_t count) {
    mpack_assert(reader->fill != NULL, "missing fill function!");
    mpack_assert(reader->data == reader->end, "there are bytes left in the buffer!");
    mpack_assert(reader->error == mpack_ok, "should not have called this in an error state (%i)", reader->error);
    mpack_log("skip using fill for %i bytes\n", (int)count);

    // fill and discard multiples of the buffer size
    while (count > reader->size) {
        mpack_log("filling and discarding buffer of %i bytes\n", (int)reader->size);
        if (mpack_fill_range(reader, reader->buffer, reader->size, reader->size) < reader->size) {
            mpack_reader_flag_error(reader, mpack_error_io);
            return;
        }
        count -= reader->size;
    }

    // fill the buffer as much as possible
    reader->data = reader->buffer;
    size_t read = mpack_fill_range(reader, reader->buffer, count, reader->size);
    if (read < count) {
        mpack_reader_flag_error(reader, mpack_error_io);
        return;
    }
    reader->end = reader->data + read;
    mpack_log("filled %i bytes into buffer; discarding %i bytes\n", (int)read, (int)count);
    reader->data += count;
}